

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O2

void put_LZW_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  JDIMENSION JVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  bool bVar11;
  
  pbVar10 = *dinfo->buffer;
  JVar5 = cinfo->output_width;
LAB_0010492f:
  do {
    while( true ) {
      while( true ) {
        bVar11 = JVar5 == 0;
        JVar5 = JVar5 - 1;
        if (bVar11) {
          return;
        }
        bVar1 = *pbVar10;
        pbVar10 = pbVar10 + 1;
        if (*(int *)&dinfo[1].output_file == 0) break;
        *(ushort *)((long)&dinfo[1].calc_buffer_dimensions + 4) = (ushort)bVar1;
        *(undefined4 *)&dinfo[1].output_file = 0;
      }
      sVar2 = *(short *)((long)&dinfo[1].calc_buffer_dimensions + 4);
      iVar8 = (uint)bVar1 * 0x10 + (int)sVar2;
      iVar4 = (uint)bVar1 * 0x10 + -0x138b + (int)sVar2;
      if (iVar8 < 0x138b) {
        iVar4 = iVar8;
      }
      iVar8 = (int)CONCAT21(sVar2,bVar1);
      lVar9 = (long)iVar4;
      sVar3 = *(short *)(*(long *)&dinfo[1].buffer_height + lVar9 * 2);
      if (sVar3 != 0) break;
LAB_001049e1:
      output((gif_dest_ptr)dinfo,sVar2);
      sVar2 = *(short *)&dinfo[1].buffer;
      if (sVar2 < 0x1000) {
        *(short *)&dinfo[1].buffer = sVar2 + 1;
        *(short *)(*(long *)&dinfo[1].buffer_height + lVar9 * 2) = sVar2;
        *(int *)(dinfo[2].start_output + lVar9 * 4) = iVar8;
      }
      else {
        clear_block((gif_dest_ptr)dinfo);
      }
      *(ushort *)((long)&dinfo[1].calc_buffer_dimensions + 4) = (ushort)bVar1;
    }
    if (*(int *)(dinfo[2].start_output + lVar9 * 4) == iVar8) {
      *(short *)((long)&dinfo[1].calc_buffer_dimensions + 4) = sVar3;
      goto LAB_0010492f;
    }
    uVar6 = -(uint)(iVar4 == 0) | iVar4 - 0x138bU;
    do {
      iVar7 = iVar4 + uVar6;
      iVar4 = iVar4 + 0x138b + uVar6;
      if (-1 < iVar7) {
        iVar4 = iVar7;
      }
      lVar9 = (long)iVar4;
      sVar3 = *(short *)(*(long *)&dinfo[1].buffer_height + lVar9 * 2);
      if (sVar3 == 0) goto LAB_001049e1;
    } while (*(int *)(dinfo[2].start_output + lVar9 * 4) != iVar8);
    *(short *)((long)&dinfo[1].calc_buffer_dimensions + 4) = sVar3;
  } while( true );
}

Assistant:

METHODDEF(void)
put_LZW_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                   JDIMENSION rows_supplied)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;
  code_int c;
  register hash_int i;
  register hash_int disp;
  register hash_entry probe_value;

  ptr = dest->pub.buffer[0];
  for (col = cinfo->output_width; col > 0; col--) {
    /* Accept and compress one 8-bit byte */
    c = (code_int)(*ptr++);

    if (dest->first_byte) {     /* need to initialize waiting_code */
      dest->waiting_code = c;
      dest->first_byte = FALSE;
      continue;
    }

    /* Probe hash table to see if a symbol exists for
     * waiting_code followed by c.
     * If so, replace waiting_code by that symbol and continue.
     */
    i = ((hash_int)c << (MAX_LZW_BITS - 8)) + dest->waiting_code;
    /* i is less than twice 2**MAX_LZW_BITS, therefore less than twice HSIZE */
    if (i >= HSIZE)
      i -= HSIZE;

    probe_value = HASH_ENTRY(dest->waiting_code, c);

    if (dest->hash_code[i] == 0) {
      /* hit empty slot; desired symbol not in table */
      output(dest, dest->waiting_code);
      if (dest->free_code < LZW_TABLE_SIZE) {
        dest->hash_code[i] = dest->free_code++; /* add symbol to hashtable */
        dest->hash_value[i] = probe_value;
      } else
        clear_block(dest);
      dest->waiting_code = c;
      continue;
    }
    if (dest->hash_value[i] == probe_value) {
      dest->waiting_code = dest->hash_code[i];
      continue;
    }

    if (i == 0)                 /* secondary hash (after G. Knott) */
      disp = 1;
    else
      disp = HSIZE - i;
    for (;;) {
      i -= disp;
      if (i < 0)
        i += HSIZE;
      if (dest->hash_code[i] == 0) {
        /* hit empty slot; desired symbol not in table */
        output(dest, dest->waiting_code);
        if (dest->free_code < LZW_TABLE_SIZE) {
          dest->hash_code[i] = dest->free_code++; /* add symbol to hashtable */
          dest->hash_value[i] = probe_value;
        } else
          clear_block(dest);
        dest->waiting_code = c;
        break;
      }
      if (dest->hash_value[i] == probe_value) {
        dest->waiting_code = dest->hash_code[i];
        break;
      }
    }
  }
}